

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

raw_problem_status read_quadratic_element(stream_buffer *buf,problem_parser *p,double sign_factor)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  basic_string_view<char,_std::char_traits<char>_> *pbVar6;
  basic_string_view<char,_std::char_traits<char>_> *pbVar7;
  string_view *psVar8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar9;
  basic_string_view<char,_std::char_traits<char>_> *pbVar10;
  size_t sVar11;
  char *pcVar12;
  pointer poVar13;
  size_t sVar14;
  char *pcVar15;
  string_view value;
  bool bVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  reference pvVar20;
  uint uVar21;
  pointer poVar22;
  pointer poVar23;
  undefined8 uVar24;
  undefined4 size;
  char *pcVar25;
  size_type __rlen;
  long lVar26;
  raw_problem_status rVar27;
  string_view sVar28;
  string_view value_00;
  string_view value_01;
  value_type tmp;
  uint local_e4;
  double local_98;
  _Storage<function_element_token,_true> local_88;
  char local_68;
  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  *local_60;
  size_t local_58;
  char *pcStack_50;
  size_t local_40;
  char *pcStack_38;
  
  uVar19 = 7;
  if ((buf->buffer_ptr)._M_elems[0]._M_len == 1) {
    iVar17 = bcmp((buf->buffer_ptr)._M_elems[0]._M_str,"[",1);
    if (iVar17 == 0) {
      local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
      local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
      pbVar1 = (buf->buffer_ptr)._M_elems + 1;
      pcVar25 = (buf->buffer_ptr)._M_elems[1]._M_str;
      sVar11 = (buf->buffer_ptr)._M_elems[2]._M_len;
      pcVar12 = (buf->buffer_ptr)._M_elems[2]._M_str;
      sVar14 = (buf->buffer_ptr)._M_elems[3]._M_len;
      pcVar15 = (buf->buffer_ptr)._M_elems[3]._M_str;
      (buf->buffer_ptr)._M_elems[0]._M_len = (buf->buffer_ptr)._M_elems[1]._M_len;
      (buf->buffer_ptr)._M_elems[0]._M_str = pcVar25;
      pbVar2 = (buf->buffer_ptr)._M_elems + 2;
      (buf->buffer_ptr)._M_elems[1]._M_len = sVar11;
      (buf->buffer_ptr)._M_elems[1]._M_str = pcVar12;
      pbVar3 = (buf->buffer_ptr)._M_elems + 3;
      (buf->buffer_ptr)._M_elems[2]._M_len = sVar14;
      (buf->buffer_ptr)._M_elems[2]._M_str = pcVar15;
      pbVar4 = (buf->buffer_ptr)._M_elems + 4;
      pcVar25 = (buf->buffer_ptr)._M_elems[4]._M_str;
      sVar11 = (buf->buffer_ptr)._M_elems[5]._M_len;
      pcVar12 = (buf->buffer_ptr)._M_elems[5]._M_str;
      (buf->buffer_ptr)._M_elems[3]._M_len = (buf->buffer_ptr)._M_elems[4]._M_len;
      (buf->buffer_ptr)._M_elems[3]._M_str = pcVar25;
      (buf->buffer_ptr)._M_elems[4]._M_len = sVar11;
      (buf->buffer_ptr)._M_elems[4]._M_str = pcVar12;
      pbVar5 = (buf->buffer_ptr)._M_elems + 5;
      pbVar6 = (buf->buffer_ptr)._M_elems + 6;
      pcVar25 = (buf->buffer_ptr)._M_elems[6]._M_str;
      sVar11 = (buf->buffer_ptr)._M_elems[7]._M_len;
      pcVar12 = (buf->buffer_ptr)._M_elems[7]._M_str;
      (buf->buffer_ptr)._M_elems[5]._M_len = (buf->buffer_ptr)._M_elems[6]._M_len;
      (buf->buffer_ptr)._M_elems[5]._M_str = pcVar25;
      (buf->buffer_ptr)._M_elems[6]._M_len = sVar11;
      (buf->buffer_ptr)._M_elems[6]._M_str = pcVar12;
      pbVar7 = (buf->buffer_ptr)._M_elems + 7;
      pbVar9 = (buf->buffer_ptr)._M_elems + 8;
      pcVar25 = (buf->buffer_ptr)._M_elems[8]._M_str;
      (buf->buffer_ptr)._M_elems[7]._M_len = (buf->buffer_ptr)._M_elems[8]._M_len;
      (buf->buffer_ptr)._M_elems[7]._M_str = pcVar25;
      pbVar10 = (buf->buffer_ptr)._M_elems + 9;
      pcVar25 = (buf->buffer_ptr)._M_elems[9]._M_str;
      (buf->buffer_ptr)._M_elems[8]._M_len = (buf->buffer_ptr)._M_elems[9]._M_len;
      (buf->buffer_ptr)._M_elems[8]._M_str = pcVar25;
      (buf->buffer_ptr)._M_elems[9]._M_len = (size_t)local_88._M_value.factor;
      (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
      sVar28 = stream_buffer::next_token(buf);
      (buf->buffer_ptr)._M_elems[9] = sVar28;
      local_60 = &(p->m_problem).objective.qelements;
      do {
        sVar11 = (buf->buffer_ptr)._M_elems[0]._M_len;
        sVar28._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        sVar28._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        if (sVar11 == 1) {
          iVar17 = bcmp((buf->buffer_ptr)._M_elems[0]._M_str,"]",1);
          if (iVar17 == 0) goto LAB_0012bcc2;
        }
        else if (sVar11 == 0) {
LAB_0012bcc2:
          local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
          local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
          pcVar25 = (buf->buffer_ptr)._M_elems[1]._M_str;
          (buf->buffer_ptr)._M_elems[0]._M_len = pbVar1->_M_len;
          (buf->buffer_ptr)._M_elems[0]._M_str = pcVar25;
          pcVar25 = (buf->buffer_ptr)._M_elems[2]._M_str;
          pbVar1->_M_len = pbVar2->_M_len;
          (buf->buffer_ptr)._M_elems[1]._M_str = pcVar25;
          pcVar25 = (buf->buffer_ptr)._M_elems[3]._M_str;
          pbVar2->_M_len = pbVar3->_M_len;
          (buf->buffer_ptr)._M_elems[2]._M_str = pcVar25;
          pcVar25 = (buf->buffer_ptr)._M_elems[4]._M_str;
          pbVar3->_M_len = pbVar4->_M_len;
          (buf->buffer_ptr)._M_elems[3]._M_str = pcVar25;
          pcVar25 = (buf->buffer_ptr)._M_elems[5]._M_str;
          pbVar4->_M_len = pbVar5->_M_len;
          (buf->buffer_ptr)._M_elems[4]._M_str = pcVar25;
          pcVar25 = (buf->buffer_ptr)._M_elems[6]._M_str;
          pbVar5->_M_len = pbVar6->_M_len;
          (buf->buffer_ptr)._M_elems[5]._M_str = pcVar25;
          pcVar25 = (buf->buffer_ptr)._M_elems[7]._M_str;
          pbVar6->_M_len = pbVar7->_M_len;
          (buf->buffer_ptr)._M_elems[6]._M_str = pcVar25;
          pcVar25 = (buf->buffer_ptr)._M_elems[8]._M_str;
          pbVar7->_M_len = pbVar9->_M_len;
          (buf->buffer_ptr)._M_elems[7]._M_str = pcVar25;
          pcVar25 = (buf->buffer_ptr)._M_elems[9]._M_str;
          pbVar9->_M_len = pbVar10->_M_len;
          (buf->buffer_ptr)._M_elems[8]._M_str = pcVar25;
          pbVar10->_M_len = (size_t)local_88._M_value.factor;
          (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
          sVar28 = stream_buffer::next_token(buf);
          (buf->buffer_ptr)._M_elems[9] = sVar28;
          sVar11 = (buf->buffer_ptr)._M_elems[0]._M_len;
          pcVar25 = (buf->buffer_ptr)._M_elems[0]._M_str;
          if (sVar11 == 2) {
            iVar17 = bcmp(pcVar25,"/2",2);
            uVar19 = 7;
            if (iVar17 != 0) goto LAB_0012be84;
            local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
            local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
            pcVar25 = (buf->buffer_ptr)._M_elems[1]._M_str;
            (buf->buffer_ptr)._M_elems[0]._M_len = pbVar1->_M_len;
            (buf->buffer_ptr)._M_elems[0]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[2]._M_str;
            pbVar1->_M_len = pbVar2->_M_len;
            (buf->buffer_ptr)._M_elems[1]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[3]._M_str;
            pbVar2->_M_len = pbVar3->_M_len;
            (buf->buffer_ptr)._M_elems[2]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[4]._M_str;
            pbVar3->_M_len = pbVar4->_M_len;
            (buf->buffer_ptr)._M_elems[3]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[5]._M_str;
            pbVar4->_M_len = pbVar5->_M_len;
            (buf->buffer_ptr)._M_elems[4]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[6]._M_str;
            pbVar5->_M_len = pbVar6->_M_len;
            (buf->buffer_ptr)._M_elems[5]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[7]._M_str;
            pbVar6->_M_len = pbVar7->_M_len;
            (buf->buffer_ptr)._M_elems[6]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[8]._M_str;
            pbVar7->_M_len = pbVar9->_M_len;
            (buf->buffer_ptr)._M_elems[7]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[9]._M_str;
            pbVar9->_M_len = pbVar10->_M_len;
            (buf->buffer_ptr)._M_elems[8]._M_str = pcVar25;
            pbVar10->_M_len = (size_t)local_88._M_value.factor;
            (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
            sVar28 = stream_buffer::next_token(buf);
            (buf->buffer_ptr)._M_elems[9] = sVar28;
          }
          else {
            if ((((sVar11 != 1) || (iVar17 = bcmp(pcVar25,"/",1), iVar17 != 0)) ||
                (pbVar1->_M_len != 1)) ||
               (iVar17 = bcmp((buf->buffer_ptr)._M_elems[1]._M_str,"2",1), iVar17 != 0))
            goto LAB_0012b4e0;
            local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
            local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
            pcVar25 = (buf->buffer_ptr)._M_elems[2]._M_str;
            (buf->buffer_ptr)._M_elems[0]._M_len = pbVar2->_M_len;
            (buf->buffer_ptr)._M_elems[0]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[3]._M_str;
            pbVar1->_M_len = pbVar3->_M_len;
            (buf->buffer_ptr)._M_elems[1]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[4]._M_str;
            pbVar2->_M_len = pbVar4->_M_len;
            (buf->buffer_ptr)._M_elems[2]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[5]._M_str;
            pbVar3->_M_len = pbVar5->_M_len;
            (buf->buffer_ptr)._M_elems[3]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[6]._M_str;
            pbVar4->_M_len = pbVar6->_M_len;
            (buf->buffer_ptr)._M_elems[4]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[7]._M_str;
            pbVar5->_M_len = pbVar7->_M_len;
            (buf->buffer_ptr)._M_elems[5]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[8]._M_str;
            pbVar6->_M_len = pbVar9->_M_len;
            (buf->buffer_ptr)._M_elems[6]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[9]._M_str;
            pbVar7->_M_len = pbVar10->_M_len;
            (buf->buffer_ptr)._M_elems[7]._M_str = pcVar25;
            pcVar25 = (buf->buffer_ptr)._M_elems[0]._M_str;
            pbVar9->_M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
            (buf->buffer_ptr)._M_elems[8]._M_str = pcVar25;
            pbVar10->_M_len = (size_t)local_88._M_value.factor;
            (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
            lVar26 = 0x88;
            do {
              sVar28 = stream_buffer::next_token(buf);
              *(size_t *)((long)(buf->buffer_ptr)._M_elems + lVar26 + -8) = sVar28._M_len;
              *(char **)((long)&(buf->buffer_ptr)._M_elems[0]._M_len + lVar26) = sVar28._M_str;
              lVar26 = lVar26 + 0x10;
            } while (lVar26 != 0xa8);
          }
          uVar19 = 0;
          goto LAB_0012be84;
        }
        psVar8 = (buf->buffer_ptr)._M_elems + 2;
        local_40 = psVar8->_M_len;
        pcStack_38 = (buf->buffer_ptr)._M_elems[2]._M_str;
        read_quadratic_element
                  ((optional<function_element_token> *)&local_88._M_value,sVar28,
                   (buf->buffer_ptr)._M_elems[1],*psVar8);
        if (local_68 == '\x01') {
          local_98 = local_88._M_value.factor;
          pcVar25 = (char *)CONCAT71(local_88._17_7_,local_88._16_1_);
          uVar24 = local_88._M_value.name._M_len;
          size = local_88._M_value.read;
        }
        else {
          local_e4 = 7;
          local_98 = 0.0;
          size = 0;
          pcVar25 = (char *)0x0;
          uVar24 = (char *)0x0;
        }
        if (local_68 == '\0') {
LAB_0012bad3:
          bVar16 = false;
        }
        else {
          stream_buffer::pop_front(buf,size);
          sVar11 = (buf->buffer_ptr)._M_elems[0]._M_len;
          pcVar12 = (buf->buffer_ptr)._M_elems[0]._M_str;
          if ((sVar11 == 1) && (iVar17 = bcmp(pcVar12,"*",1), iVar17 == 0)) {
            read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      &local_88._M_value,(buf->buffer_ptr)._M_elems[1]);
            if (local_88._16_1_ == '\0') {
              local_e4 = 7;
              goto LAB_0012bad3;
            }
            value_01._M_str = pcVar25;
            value_01._M_len = uVar24;
            iVar17 = problem_parser::get_or_assign_variable(p,value_01);
            value._M_str = (char *)local_88._M_value.name._M_len;
            value._M_len = (size_t)local_88._M_value.factor;
            iVar18 = problem_parser::get_or_assign_variable(p,value);
            uVar21 = 0xb;
            if (iVar18 != -1 && iVar17 != -1) {
              poVar23 = (p->m_problem).objective.qelements.
                        super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              poVar13 = (p->m_problem).objective.qelements.
                        super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              lVar26 = (long)poVar13 - (long)poVar23 >> 6;
              poVar22 = poVar23;
              if (0 < lVar26) {
                poVar22 = (pointer)((long)&poVar23->factor +
                                   ((long)poVar13 - (long)poVar23 & 0xffffffffffffffc0U));
                lVar26 = lVar26 + 1;
                poVar23 = poVar23 + 2;
                do {
                  if (((poVar23[-2].variable_index_a == iVar17) &&
                      (poVar23[-2].variable_index_b == iVar18)) ||
                     ((poVar23[-2].variable_index_a == iVar18 &&
                      (poVar23[-2].variable_index_b == iVar17)))) {
                    poVar23 = poVar23 + -2;
                    goto LAB_0012bb9c;
                  }
                  if (((poVar23[-1].variable_index_a == iVar17) &&
                      (poVar23[-1].variable_index_b == iVar18)) ||
                     ((poVar23[-1].variable_index_a == iVar18 &&
                      (poVar23[-1].variable_index_b == iVar17)))) {
                    poVar23 = poVar23 + -1;
                    goto LAB_0012bb9c;
                  }
                  if (((poVar23->variable_index_a == iVar17) &&
                      (poVar23->variable_index_b == iVar18)) ||
                     ((poVar23->variable_index_a == iVar18 && (poVar23->variable_index_b == iVar17))
                     )) goto LAB_0012bb9c;
                  if (((poVar23[1].variable_index_a == iVar17) &&
                      (poVar23[1].variable_index_b == iVar18)) ||
                     ((poVar23[1].variable_index_a == iVar18 &&
                      (poVar23[1].variable_index_b == iVar17)))) {
                    poVar23 = poVar23 + 1;
                    goto LAB_0012bb9c;
                  }
                  lVar26 = lVar26 + -1;
                  poVar23 = poVar23 + 4;
                } while (1 < lVar26);
              }
              lVar26 = (long)poVar13 - (long)poVar22 >> 4;
              if (lVar26 == 1) {
LAB_0012ba30:
                if ((((poVar22->variable_index_a != iVar17) ||
                     (poVar23 = poVar22, poVar22->variable_index_b != iVar18)) &&
                    (poVar23 = poVar13, poVar22->variable_index_a == iVar18)) &&
                   (poVar23 = poVar22, poVar22->variable_index_b != iVar17)) {
                  poVar23 = poVar13;
                }
              }
              else if (lVar26 == 2) {
LAB_0012ba15:
                poVar23 = poVar22;
                if (((poVar22->variable_index_a != iVar17) || (poVar22->variable_index_b != iVar18))
                   && ((poVar22->variable_index_a != iVar18 || (poVar22->variable_index_b != iVar17)
                       ))) {
                  poVar22 = poVar22 + 1;
                  goto LAB_0012ba30;
                }
              }
              else {
                poVar23 = poVar13;
                if (((lVar26 == 3) &&
                    ((poVar23 = poVar22, poVar22->variable_index_a != iVar17 ||
                     (poVar22->variable_index_b != iVar18)))) &&
                   ((poVar22->variable_index_a != iVar18 || (poVar22->variable_index_b != iVar17))))
                {
                  poVar22 = poVar22 + 1;
                  goto LAB_0012ba15;
                }
              }
LAB_0012bb9c:
              if (poVar23 == poVar13) {
                pvVar20 = std::
                          vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                          ::emplace_back<>(local_60);
                pvVar20->factor = local_98 * sign_factor * 0.5;
                pvVar20->variable_index_a = iVar17;
                pvVar20->variable_index_b = iVar18;
              }
              else {
                poVar23->factor = local_98 * sign_factor * 0.5 + poVar23->factor;
              }
              local_58 = (buf->buffer_ptr)._M_elems[0]._M_len;
              pcStack_50 = (buf->buffer_ptr)._M_elems[0]._M_str;
              pcVar25 = (buf->buffer_ptr)._M_elems[2]._M_str;
              (buf->buffer_ptr)._M_elems[0]._M_len = pbVar2->_M_len;
              (buf->buffer_ptr)._M_elems[0]._M_str = pcVar25;
              pcVar25 = (buf->buffer_ptr)._M_elems[3]._M_str;
              pbVar1->_M_len = pbVar3->_M_len;
              (buf->buffer_ptr)._M_elems[1]._M_str = pcVar25;
              pcVar25 = (buf->buffer_ptr)._M_elems[4]._M_str;
              pbVar2->_M_len = pbVar4->_M_len;
              (buf->buffer_ptr)._M_elems[2]._M_str = pcVar25;
              pcVar25 = (buf->buffer_ptr)._M_elems[5]._M_str;
              pbVar3->_M_len = pbVar5->_M_len;
              (buf->buffer_ptr)._M_elems[3]._M_str = pcVar25;
              pcVar25 = (buf->buffer_ptr)._M_elems[6]._M_str;
              pbVar4->_M_len = pbVar6->_M_len;
              (buf->buffer_ptr)._M_elems[4]._M_str = pcVar25;
              pcVar25 = (buf->buffer_ptr)._M_elems[7]._M_str;
              pbVar5->_M_len = pbVar7->_M_len;
              (buf->buffer_ptr)._M_elems[5]._M_str = pcVar25;
              pcVar25 = (buf->buffer_ptr)._M_elems[8]._M_str;
              pbVar6->_M_len = pbVar9->_M_len;
              (buf->buffer_ptr)._M_elems[6]._M_str = pcVar25;
              pcVar25 = (buf->buffer_ptr)._M_elems[9]._M_str;
              pbVar7->_M_len = pbVar10->_M_len;
              (buf->buffer_ptr)._M_elems[7]._M_str = pcVar25;
              pcVar25 = (buf->buffer_ptr)._M_elems[0]._M_str;
              pbVar9->_M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
              (buf->buffer_ptr)._M_elems[8]._M_str = pcVar25;
              pbVar10->_M_len = local_58;
              (buf->buffer_ptr)._M_elems[9]._M_str = pcStack_50;
              lVar26 = 0x88;
              do {
                sVar28 = stream_buffer::next_token(buf);
                *(size_t *)((long)(buf->buffer_ptr)._M_elems + lVar26 + -8) = sVar28._M_len;
                *(char **)((long)&(buf->buffer_ptr)._M_elems[0]._M_len + lVar26) = sVar28._M_str;
                lVar26 = lVar26 + 0x10;
                uVar21 = local_e4;
              } while (lVar26 != 0xa8);
            }
            local_e4 = uVar21;
            if (iVar18 == -1 || iVar17 == -1) {
              bVar16 = false;
              goto LAB_0012bcad;
            }
          }
          else if (((sVar11 == 1) && (iVar17 = bcmp(pcVar12,"^",1), iVar17 == 0)) ||
                  ((sVar11 == 2 && (iVar17 = bcmp(pcVar12,"^2",2), iVar17 == 0)))) {
            if ((sVar11 == 1) &&
               (((iVar17 = bcmp(pcVar12,"^",1), iVar17 == 0 && (pbVar1->_M_len == 1)) &&
                (iVar17 = bcmp((buf->buffer_ptr)._M_elems[1]._M_str,"2",1), iVar17 == 0)))) {
              local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
              local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
              pcVar12 = (buf->buffer_ptr)._M_elems[2]._M_str;
              (buf->buffer_ptr)._M_elems[0]._M_len = pbVar2->_M_len;
              (buf->buffer_ptr)._M_elems[0]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[3]._M_str;
              pbVar1->_M_len = pbVar3->_M_len;
              (buf->buffer_ptr)._M_elems[1]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[4]._M_str;
              pbVar2->_M_len = pbVar4->_M_len;
              (buf->buffer_ptr)._M_elems[2]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[5]._M_str;
              pbVar3->_M_len = pbVar5->_M_len;
              (buf->buffer_ptr)._M_elems[3]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[6]._M_str;
              pbVar4->_M_len = pbVar6->_M_len;
              (buf->buffer_ptr)._M_elems[4]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[7]._M_str;
              pbVar5->_M_len = pbVar7->_M_len;
              (buf->buffer_ptr)._M_elems[5]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[8]._M_str;
              pbVar6->_M_len = pbVar9->_M_len;
              (buf->buffer_ptr)._M_elems[6]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[9]._M_str;
              pbVar7->_M_len = pbVar10->_M_len;
              (buf->buffer_ptr)._M_elems[7]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[0]._M_str;
              pbVar9->_M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
              (buf->buffer_ptr)._M_elems[8]._M_str = pcVar12;
              pbVar10->_M_len = (size_t)local_88._M_value.factor;
              (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
              lVar26 = 0x88;
              do {
                sVar28 = stream_buffer::next_token(buf);
                *(size_t *)((long)(buf->buffer_ptr)._M_elems + lVar26 + -8) = sVar28._M_len;
                *(char **)((long)&(buf->buffer_ptr)._M_elems[0]._M_len + lVar26) = sVar28._M_str;
                lVar26 = lVar26 + 0x10;
              } while (lVar26 != 0xa8);
            }
            else {
              local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
              local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
              pcVar12 = (buf->buffer_ptr)._M_elems[1]._M_str;
              (buf->buffer_ptr)._M_elems[0]._M_len = pbVar1->_M_len;
              (buf->buffer_ptr)._M_elems[0]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[2]._M_str;
              pbVar1->_M_len = pbVar2->_M_len;
              (buf->buffer_ptr)._M_elems[1]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[3]._M_str;
              pbVar2->_M_len = pbVar3->_M_len;
              (buf->buffer_ptr)._M_elems[2]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[4]._M_str;
              pbVar3->_M_len = pbVar4->_M_len;
              (buf->buffer_ptr)._M_elems[3]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[5]._M_str;
              pbVar4->_M_len = pbVar5->_M_len;
              (buf->buffer_ptr)._M_elems[4]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[6]._M_str;
              pbVar5->_M_len = pbVar6->_M_len;
              (buf->buffer_ptr)._M_elems[5]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[7]._M_str;
              pbVar6->_M_len = pbVar7->_M_len;
              (buf->buffer_ptr)._M_elems[6]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[8]._M_str;
              pbVar7->_M_len = pbVar9->_M_len;
              (buf->buffer_ptr)._M_elems[7]._M_str = pcVar12;
              pcVar12 = (buf->buffer_ptr)._M_elems[9]._M_str;
              pbVar9->_M_len = pbVar10->_M_len;
              (buf->buffer_ptr)._M_elems[8]._M_str = pcVar12;
              pbVar10->_M_len = (size_t)local_88._M_value.factor;
              (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
              sVar28 = stream_buffer::next_token(buf);
              (buf->buffer_ptr)._M_elems[9] = sVar28;
            }
            value_00._M_str = pcVar25;
            value_00._M_len = uVar24;
            iVar17 = problem_parser::get_or_assign_variable(p,value_00);
            if (iVar17 == -1) {
              local_e4 = 0xb;
            }
            else {
              poVar23 = (p->m_problem).objective.qelements.
                        super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              poVar13 = (p->m_problem).objective.qelements.
                        super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              lVar26 = (long)poVar13 - (long)poVar23 >> 6;
              poVar22 = poVar23;
              if (0 < lVar26) {
                poVar22 = (pointer)((long)&poVar23->factor +
                                   ((long)poVar13 - (long)poVar23 & 0xffffffffffffffc0U));
                lVar26 = lVar26 + 1;
                poVar23 = poVar23 + 2;
                do {
                  if ((poVar23[-2].variable_index_a == iVar17) &&
                     (poVar23[-2].variable_index_b == iVar17)) {
                    poVar23 = poVar23 + -2;
                    goto LAB_0012ba7c;
                  }
                  if ((poVar23[-1].variable_index_a == iVar17) &&
                     (poVar23[-1].variable_index_b == iVar17)) {
                    poVar23 = poVar23 + -1;
                    goto LAB_0012ba7c;
                  }
                  if ((poVar23->variable_index_a == iVar17) && (poVar23->variable_index_b == iVar17)
                     ) goto LAB_0012ba7c;
                  if ((poVar23[1].variable_index_a == iVar17) &&
                     (poVar23[1].variable_index_b == iVar17)) {
                    poVar23 = poVar23 + 1;
                    goto LAB_0012ba7c;
                  }
                  lVar26 = lVar26 + -1;
                  poVar23 = poVar23 + 4;
                } while (1 < lVar26);
              }
              lVar26 = (long)poVar13 - (long)poVar22 >> 4;
              if (lVar26 == 1) {
LAB_0012b89b:
                poVar23 = poVar22;
                if (poVar22->variable_index_b != iVar17 || poVar22->variable_index_a != iVar17) {
                  poVar23 = poVar13;
                }
              }
              else if (lVar26 == 2) {
LAB_0012b88d:
                if ((poVar22->variable_index_a != iVar17) ||
                   (poVar23 = poVar22, poVar22->variable_index_b != iVar17)) {
                  poVar22 = poVar22 + 1;
                  goto LAB_0012b89b;
                }
              }
              else {
                poVar23 = poVar13;
                if ((lVar26 == 3) &&
                   ((poVar22->variable_index_a != iVar17 ||
                    (poVar23 = poVar22, poVar22->variable_index_b != iVar17)))) {
                  poVar22 = poVar22 + 1;
                  goto LAB_0012b88d;
                }
              }
LAB_0012ba7c:
              if (poVar23 == poVar13) {
                pvVar20 = std::
                          vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                          ::emplace_back<>(local_60);
                pvVar20->factor = local_98 * sign_factor * 0.5;
                pvVar20->variable_index_a = iVar17;
                pvVar20->variable_index_b = iVar17;
              }
              else {
                poVar23->factor = local_98 * sign_factor * 0.5 + poVar23->factor;
              }
            }
            if (iVar17 == -1) goto LAB_0012bad3;
          }
          bVar16 = true;
        }
LAB_0012bcad:
      } while (bVar16);
      uVar19 = (ulong)local_e4;
    }
    else {
LAB_0012b4e0:
      uVar19 = 7;
    }
  }
LAB_0012be84:
  rVar27.column = 0;
  rVar27.tag = (int)uVar19;
  rVar27.line = (int)(uVar19 >> 0x20);
  return rVar27;
}

Assistant:

raw_problem_status
read_quadratic_element(stream_buffer& buf,
                       problem_parser& p,
                       double sign_factor) noexcept
{
    if (buf.first() != "[")
        return baryonyx::file_format_error_tag::bad_objective_quadratic;

    buf.pop_front();

    while (!buf.first().empty() && buf.first() != "]") {
        function_element_token fct;

        if (auto fct_opt =
              read_quadratic_element(buf.first(), buf.second(), buf.third());
            !fct_opt)
            return baryonyx::file_format_error_tag::bad_objective_quadratic;
        else
            fct = *fct_opt;

        buf.pop_front(fct.read);

        if (buf.first() == "*") {
            auto name_opt = read_name(buf.second());
            if (!name_opt.has_value())
                return baryonyx::file_format_error_tag::
                  bad_objective_quadratic;

            auto id1 = p.get_or_assign_variable(fct.name);
            auto id2 = p.get_or_assign_variable(*name_opt);

            if (id1 == -1 || id2 == -1)
                return baryonyx::file_format_error_tag::too_many_variables;

            auto it = std::find_if(p.m_problem.objective.qelements.begin(),
                                   p.m_problem.objective.qelements.end(),
                                   [id1, id2](const auto& elem) {
                                       return (elem.variable_index_a == id1 &&
                                               elem.variable_index_b == id2) ||
                                              (elem.variable_index_a == id2 &&
                                               elem.variable_index_b == id1);
                                   });
            if (it == p.m_problem.objective.qelements.end()) {
                auto& ret = p.m_problem.objective.qelements.emplace_back();
                ret.factor = fct.factor * sign_factor / 2.0;
                ret.variable_index_a = id1;
                ret.variable_index_b = id2;
            } else {
                it->factor += fct.factor * sign_factor / 2.0;
            }

            buf.pop_front(2);
        } else if (buf.first() == "^" || buf.first() == "^2") {
            if (buf.first() == "^" && buf.second() == "2")
                buf.pop_front(2);
            else
                buf.pop_front(1);

            auto id = p.get_or_assign_variable(fct.name);
            if (id == -1)
                return baryonyx::file_format_error_tag::too_many_variables;

            auto it = std::find_if(p.m_problem.objective.qelements.begin(),
                                   p.m_problem.objective.qelements.end(),
                                   [id](const auto& elem) {
                                       return elem.variable_index_a == id &&
                                              elem.variable_index_b == id;
                                   });

            if (it == p.m_problem.objective.qelements.end()) {
                auto& ret = p.m_problem.objective.qelements.emplace_back();
                ret.factor = fct.factor * sign_factor / 2.0;
                ret.variable_index_a = id;
                ret.variable_index_b = id;
            } else {
                it->factor += fct.factor * sign_factor / 2.0;
            }
        }
    }

    buf.pop_front();

    if (buf.first() == "/" && buf.second() == "2")
        buf.pop_front(2);
    else if (buf.first() == "/2")
        buf.pop_front(1);
    else
        return baryonyx::file_format_error_tag::bad_objective_quadratic;

    return baryonyx::file_format_error_tag::success;
}